

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_ini
          (App *this,vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *args)

{
  ini_ret_t *this_00;
  pointer piVar1;
  pointer puVar2;
  App *this_01;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  Option *pOVar3;
  bool bVar4;
  byte bVar5;
  string *psVar6;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var7;
  reference pvVar8;
  unsigned_long uVar9;
  INIError *__return_storage_ptr__;
  ConversionError *__return_storage_ptr___00;
  pointer puVar10;
  allocator local_179;
  string val;
  string local_150;
  string parent;
  string local_110;
  anon_class_32_1_898f2789_for__M_pred local_f0;
  string name;
  string local_b0 [2];
  string local_70;
  string local_50;
  
  piVar1 = (args->
           super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = piVar1 + -1;
  detail::ini_ret_t::parent_abi_cxx11_(&parent,this_00);
  psVar6 = detail::ini_ret_t::name_abi_cxx11_(&name,this_00);
  if (parent._M_string_length != 0) {
    piVar1[-1].level = piVar1[-1].level + 1;
    puVar2 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->subcommands_).
                   super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar5 = (byte)psVar6,
        puVar10 != puVar2; puVar10 = puVar10 + 1) {
      this_01 = (puVar10->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_50,(string *)&parent);
      bVar4 = check_name(this_01,&local_50);
      psVar6 = (string *)::std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) {
        bVar5 = _parse_ini((puVar10->_M_t).
                           super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                           super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                           super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl,args);
        break;
      }
    }
    bVar4 = (bool)(puVar10 != puVar2 & bVar5);
    goto LAB_0011c7c7;
  }
  _Var7._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::string((string *)&local_f0,(string *)&name);
  _Var7 = ::std::
          find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_ini(std::vector<CLI::detail::ini_ret_t,std::allocator<CLI::detail::ini_ret_t>>&)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                    (_Var7,__last,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  if (_Var7._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = false;
    goto LAB_0011c7c7;
  }
  pOVar3 = ((_Var7._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((pOVar3->super_OptionBase<CLI::Option>).configurable_ == false) {
    __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_70,(string *)this_00);
    INIError::NotConfigurable(__return_storage_ptr__,&local_70);
    __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,Error::~Error);
  }
  if (*(pointer *)
       &(pOVar3->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl ==
      *(pointer *)
       ((long)&(pOVar3->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 8)) {
    if (pOVar3->expected_ == 0) {
      if ((long)piVar1[-1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)piVar1[-1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
        __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)local_b0,(string *)this_00);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___00,local_b0);
        __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,Error::~Error);
      }
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&piVar1[-1].inputs,0);
      ::std::__cxx11::string::string((string *)&val,(string *)pvVar8);
      ::std::__cxx11::string::string((string *)&local_110,(string *)&val);
      detail::to_lower(&local_150,&local_110);
      ::std::__cxx11::string::operator=((string *)&val,(string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_110);
      bVar4 = ::std::operator==(&val,"true");
      if (bVar4) {
LAB_0011c779:
        ::std::__cxx11::string::string((string *)&local_150,"",&local_179);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(((_Var7._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->results_,&local_150,
                   &parent);
        ::std::__cxx11::string::~string((string *)&local_150);
      }
      else {
        bVar4 = ::std::operator==(&val,"on");
        if (bVar4) goto LAB_0011c779;
        bVar4 = ::std::operator==(&val,"yes");
        if (bVar4) goto LAB_0011c779;
        bVar4 = ::std::operator==(&val,"false");
        if (!bVar4) {
          bVar4 = ::std::operator==(&val,"off");
          if (!bVar4) {
            bVar4 = ::std::operator==(&val,"no");
            if (!bVar4) {
              uVar9 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
              while (bVar4 = uVar9 != 0, uVar9 = uVar9 - 1, bVar4) {
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[1]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &(((_Var7._M_current)->_M_t).
                             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                             .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->results_,
                           (char (*) [1])0x140fe3);
              }
            }
          }
        }
      }
      ::std::__cxx11::string::~string((string *)&val);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pOVar3->results_,&piVar1[-1].inputs);
      Option::run_callback
                (((_Var7._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    }
  }
  std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::pop_back(args);
  bVar4 = true;
LAB_0011c7c7:
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&parent);
  return bVar4;
}

Assistant:

bool _parse_ini(std::vector<detail::ini_ret_t> &args) {
        detail::ini_ret_t &current = args.back();
        std::string parent = current.parent(); // respects current.level
        std::string name = current.name();

        // If a parent is listed, go to a subcommand
        if(!parent.empty()) {
            current.level++;
            for(const App_p &com : subcommands_)
                if(com->check_name(parent))
                    return com->_parse_ini(args);
            return false;
        }

        auto op_ptr = std::find_if(
            std::begin(options_), std::end(options_), [name](const Option_p &v) { return v->check_lname(name); });

        if(op_ptr == std::end(options_))
            return false;

        // Let's not go crazy with pointer syntax
        Option_p &op = *op_ptr;

        if(!op->get_configurable())
            throw INIError::NotConfigurable(current.fullname);

        if(op->results_.empty()) {
            // Flag parsing
            if(op->get_expected() == 0) {
                if(current.inputs.size() == 1) {
                    std::string val = current.inputs.at(0);
                    val = detail::to_lower(val);
                    if(val == "true" || val == "on" || val == "yes")
                        op->results_ = {""};
                    else if(val == "false" || val == "off" || val == "no")
                        ;
                    else
                        try {
                            size_t ui = std::stoul(val);
                            for(size_t i = 0; i < ui; i++)
                                op->results_.emplace_back("");
                        } catch(const std::invalid_argument &) {
                            throw ConversionError::TrueFalse(current.fullname);
                        }
                } else
                    throw ConversionError::TooManyInputsFlag(current.fullname);
            } else {
                op->results_ = current.inputs;
                op->run_callback();
            }
        }

        args.pop_back();
        return true;
    }